

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_aec.c
# Opt level: O2

int encode_decode_small(test_state *state)

{
  aec_stream *paVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uchar *puVar8;
  char *__s;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  paVar1 = state->strm;
  iVar7 = aec_encode_init(paVar1);
  if (iVar7 == 0) {
    paVar1->next_in = state->ubuf;
    paVar1->avail_in = (long)state->bytes_per_sample;
    paVar1->avail_out = 1;
    paVar1->next_out = state->cbuf;
    bVar6 = true;
    uVar9 = 0;
    bVar4 = bVar6;
    bVar5 = bVar6;
    uVar11 = 0;
    while ((bVar4 || bVar5 && (uVar11 < state->cbuf_len))) {
      if ((bVar5) && (paVar1->avail_in == 0)) {
        uVar9 = uVar9 + (long)state->bytes_per_sample;
        if (uVar9 < state->buf_len) {
          paVar1->avail_in = (long)state->bytes_per_sample;
          paVar1->next_in = state->ubuf + uVar9;
          bVar5 = bVar6;
        }
        else {
          bVar5 = false;
        }
      }
      iVar7 = aec_encode(paVar1,0);
      if (iVar7 != 0) goto LAB_0010163a;
      sVar2 = paVar1->total_out;
      bVar4 = false;
      if ((sVar2 != uVar11) && (bVar4 = false, uVar11 < state->cbuf_len)) {
        paVar1->avail_out = 1;
        paVar1->next_out = state->cbuf + sVar2;
        bVar4 = bVar6;
        uVar11 = sVar2;
      }
    }
    iVar7 = aec_encode(paVar1,1);
    if (iVar7 != 0) {
      __s = "Encode failed.";
      goto LAB_0010146e;
    }
    aec_encode_end(paVar1);
    uVar11 = paVar1->total_out;
    paVar1->avail_in = 1;
    paVar1->next_in = state->cbuf;
    paVar1->avail_out = (long)state->bytes_per_sample;
    paVar1->next_out = state->obuf;
    iVar7 = aec_decode_init(paVar1);
    if (iVar7 == 0) {
      paVar1->next_in = state->cbuf;
      paVar1->avail_in = 1;
      paVar1->avail_out = (long)state->bytes_per_sample;
      puVar8 = state->obuf;
      bVar4 = true;
      uVar10 = 0;
      uVar9 = 0;
      do {
        bVar5 = true;
        paVar1->next_out = puVar8;
        do {
          if ((!bVar5 && !bVar4) || (state->buf_len <= uVar9)) {
            iVar7 = aec_decode(paVar1,1);
            if (iVar7 == 0) {
              iVar7 = bcmp(state->ubuf,state->obuf,state->ibuf_len);
              if (iVar7 != 0) {
                printf("\n%s: Uncompressed output differs from input.\n","\x1b[0;31mFAIL\x1b[0m");
                printf("\nuncompressed buf");
                for (uVar9 = 0; uVar9 != 0x50; uVar9 = uVar9 + 1) {
                  if ((uVar9 & 7) == 0) {
                    putchar(10);
                  }
                  printf("%02x ",(ulong)state->ubuf[uVar9]);
                }
                printf("\n\ncompressed buf len %li",uVar11);
                for (uVar11 = 0; uVar11 != 0x50; uVar11 = uVar11 + 1) {
                  if ((uVar11 & 7) == 0) {
                    putchar(10);
                  }
                  printf("%02x ",(ulong)state->cbuf[uVar11]);
                }
                printf("\n\ndecompressed buf");
                for (uVar11 = 0; uVar11 != 0x50; uVar11 = uVar11 + 1) {
                  if ((uVar11 & 7) == 0) {
                    printf("\n%04i ",uVar11 & 0xffffffff);
                  }
                  printf("%02x ",(ulong)state->obuf[uVar11]);
                }
                putchar(10);
                return 99;
              }
              aec_decode_end(paVar1);
              return 0;
            }
            goto LAB_0010163a;
          }
          if ((bVar4) && (paVar1->avail_in == 0)) {
            uVar10 = uVar10 + 1;
            if (uVar10 < uVar11) {
              paVar1->avail_in = 1;
              paVar1->next_in = state->cbuf + uVar10;
              bVar4 = true;
            }
            else {
              bVar4 = false;
            }
          }
          iVar7 = aec_decode(paVar1,0);
          if (iVar7 != 0) goto LAB_0010163a;
          uVar3 = paVar1->total_out;
          bVar5 = false;
        } while ((uVar3 == uVar9) || (bVar5 = false, state->buf_len <= uVar9));
        paVar1->avail_out = (long)state->bytes_per_sample;
        puVar8 = state->obuf + uVar3;
        uVar9 = uVar3;
      } while( true );
    }
  }
  __s = "Init failed.";
  goto LAB_0010146e;
LAB_0010163a:
  __s = "Decode failed.";
LAB_0010146e:
  puts(__s);
  return 99;
}

Assistant:

int encode_decode_small(struct test_state *state)
{
    int status, i;
    size_t compressed_size;
    size_t n_in, avail_in, avail_out, total_out;
    struct aec_stream *strm = state->strm;

    status = aec_encode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    n_in = 0;
    avail_in = 1;
    avail_out = 1;
    total_out = 0;
    strm->next_in = state->ubuf;
    strm->avail_in = state->bytes_per_sample;
    strm->avail_out = 1;
    strm->next_out = state->cbuf;

    while ((avail_in || avail_out) && total_out < state->cbuf_len) {
        if (strm->avail_in == 0 && avail_in) {
            n_in += state->bytes_per_sample;
            if (n_in < state->buf_len) {
                strm->avail_in = state->bytes_per_sample;
                strm->next_in = state->ubuf + n_in;
            } else {
                avail_in = 0;
            }
        }

        status = aec_encode(strm, AEC_NO_FLUSH);
        if (status != AEC_OK) {
            printf("Decode failed.\n");
            return 99;
        }

        if (strm->total_out - total_out > 0
            && total_out < state->cbuf_len) {
            total_out = strm->total_out;
            strm->avail_out = 1;
            strm->next_out = state->cbuf + total_out;
            avail_out = 1;
        } else {
            avail_out = 0;
        }
    }

    status = aec_encode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Encode failed.\n");
        return 99;
    }

    aec_encode_end(strm);

    compressed_size = strm->total_out;

    strm->avail_in = 1;
    strm->next_in = state->cbuf;

    strm->avail_out = state->bytes_per_sample;
    strm->next_out = state->obuf;

    status = aec_decode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    n_in = 0;
    avail_in = 1;
    avail_out = 1;
    total_out = 0;
    strm->next_in = state->cbuf;
    strm->avail_in = 1;
    strm->avail_out = state->bytes_per_sample;
    strm->next_out = state->obuf;

    while ((avail_in || avail_out) && total_out < state->buf_len) {
        if (strm->avail_in == 0 && avail_in) {
            n_in++;
            if (n_in < compressed_size) {
                strm->avail_in = 1;
                strm->next_in = state->cbuf + n_in;
            } else {
                avail_in = 0;
            }
        }

        status = aec_decode(strm, AEC_NO_FLUSH);
        if (status != AEC_OK) {
            printf("Decode failed.\n");
            return 99;
        }

        if (strm->total_out - total_out > 0
            && total_out < state->buf_len) {
            total_out = strm->total_out;
            strm->avail_out = state->bytes_per_sample;
            strm->next_out = state->obuf + total_out;
            avail_out = 1;
        } else {
            avail_out = 0;
        }
    }

    status = aec_decode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Decode failed.\n");
        return 99;
    }

    if (memcmp(state->ubuf, state->obuf, state->ibuf_len)) {
        printf("\n%s: Uncompressed output differs from input.\n", CHECK_FAIL);

        printf("\nuncompressed buf");
        for (i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->ubuf[i]);
        }
        printf("\n\ncompressed buf len %li", compressed_size);
        for (i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->cbuf[i]);
        }
        printf("\n\ndecompressed buf");
        for (i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n%04i ", i);
            printf("%02x ", state->obuf[i]);
        }
        printf("\n");
        return 99;
    }
    aec_decode_end(strm);
    return 0;
}